

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDConstructGridGlobal.hpp
# Opt level: O0

void __thiscall
TasGrid::DynamicConstructorDataGlobal::restrictData
          (DynamicConstructorDataGlobal *this,int ibegin,int iend)

{
  bool bVar1;
  allocator<double> local_71;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_70;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_68;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_58;
  vector<double,_std::allocator<double>_> local_50;
  reference local_38;
  NodeData *d;
  iterator __end2;
  iterator __begin2;
  forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *__range2;
  int iend_local;
  int ibegin_local;
  DynamicConstructorDataGlobal *this_local;
  
  __end2 = ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::begin
                     (&this->data);
  d = (NodeData *)
      ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::end(&this->data);
  while( true ) {
    bVar1 = ::std::operator!=(&__end2,(_Self *)&d);
    if (!bVar1) break;
    local_38 = ::std::_Fwd_list_iterator<TasGrid::NodeData>::operator*(&__end2);
    local_60._M_current =
         (double *)::std::vector<double,_std::allocator<double>_>::begin(&local_38->value);
    local_58 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator+(&local_60,(long)ibegin);
    local_70._M_current =
         (double *)::std::vector<double,_std::allocator<double>_>::begin(&local_38->value);
    local_68 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator+(&local_70,(long)iend);
    ::std::allocator<double>::allocator(&local_71);
    ::std::vector<double,std::allocator<double>>::
    vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
              ((vector<double,std::allocator<double>> *)&local_50,local_58,local_68,&local_71);
    ::std::vector<double,_std::allocator<double>_>::operator=(&local_38->value,&local_50);
    ::std::vector<double,_std::allocator<double>_>::~vector(&local_50);
    ::std::allocator<double>::~allocator(&local_71);
    ::std::_Fwd_list_iterator<TasGrid::NodeData>::operator++(&__end2);
  }
  return;
}

Assistant:

void restrictData(int ibegin, int iend){ for(auto &d : data) d.value = std::vector<double>(d.value.begin() + ibegin, d.value.begin() + iend); }